

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadRefType(BinaryReader *this,Type *out_value,char *desc)

{
  bool bVar1;
  Result result;
  char *desc_local;
  Type *out_value_local;
  BinaryReader *this_local;
  
  result = ReadType(this,out_value,desc);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = Type::IsRef(out_value);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      PrintError(this,"%s must be a reference type",desc);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadRefType(Type* out_value, const char* desc) {
  CHECK_RESULT(ReadType(out_value, desc));
  ERROR_UNLESS(out_value->IsRef(), "%s must be a reference type", desc);
  return Result::Ok;
}